

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Alchitry_Loader.cpp
# Opt level: O1

int descriptionToType(string *des)

{
  int iVar1;
  uint uVar2;
  
  iVar1 = std::__cxx11::string::compare((char *)des);
  if (iVar1 == 0) {
    uVar2 = 2;
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)des);
    if (iVar1 == 0) {
      uVar2 = 0;
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)des);
      uVar2 = -(uint)(iVar1 != 0) | 1;
    }
  }
  return uVar2;
}

Assistant:

int descriptionToType(const string &des) {
    if (des == "Alchitry Cu A") {
        return BOARD_CU;
    } else if (des == "Alchitry Au A") {
        return BOARD_AU;
    } else if (des == "Alchitry Au+ A") {
        return BOARD_AU_PLUS;
    } else {
        return BOARD_UNKNOWN;
    }
}